

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address_base.cpp
# Opt level: O0

CreateMultisigResponseStruct *
cfd::js::api::AddressApiBase::CreateMultisig
          (CreateMultisigResponseStruct *__return_storage_ptr__,CreateMultisigRequestStruct *request
          ,AddressFactory *address_factory)

{
  bool bVar1;
  byte bVar2;
  CfdException *this;
  NetType_conflict *this_00;
  reference pbVar3;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  string local_450 [32];
  _Base_ptr local_430;
  undefined1 local_428;
  allocator local_419;
  string local_418 [32];
  string local_3f8 [32];
  _Base_ptr local_3d8;
  undefined1 local_3d0;
  allocator local_3c1;
  string local_3c0 [32];
  string local_3a0 [32];
  Address local_380 [8];
  Address addr;
  undefined1 local_208 [8];
  Script scriptsig;
  Script locking_script;
  Script multisig_script;
  undefined1 local_158 [7];
  bool is_witness;
  Script redeem_script;
  Script witness_script;
  undefined1 local_e0 [4];
  uint32_t req_sig_num;
  string local_c8 [8];
  string key;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  string local_70 [32];
  CfdSourceLocation local_50;
  AddressType local_28;
  byte local_21;
  AddressType addr_type;
  AddressFactory *address_factory_local;
  CreateMultisigRequestStruct *request_local;
  CreateMultisigResponseStruct *response;
  
  local_21 = 0;
  _addr_type = address_factory;
  address_factory_local = (AddressFactory *)request;
  request_local = (CreateMultisigRequestStruct *)__return_storage_ptr__;
  CreateMultisigResponseStruct::CreateMultisigResponseStruct(__return_storage_ptr__);
  local_28 = ConvertAddressType((string *)&address_factory_local[1].field_0x20);
  if (((local_28 != kP2shAddress) && (local_28 != kP2wshAddress)) && (local_28 != kP2shP2wshAddress)
     ) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_address_base.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x79;
    local_50.funcname = "CreateMultisig";
    core::logger::warn<cfd::core::AddressType&>
              (&local_50,"Failed to CreateMultisig. Invalid address_type passed:  addressType={}",
               &local_28);
    pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_70,
               "Invalid address_type. address_type must be \"p2sh\" \"p2wsh\" or \"p2sh-p2wsh\".",
               (allocator *)
               ((long)&pubkeys.
                       super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_70);
    pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&__range2);
  this_00 = &address_factory_local->type_;
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_00);
  local_a8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&local_a8), bVar1) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
    std::__cxx11::string::string(local_c8,(string *)pbVar3);
    cfd::core::Pubkey::Pubkey((Pubkey *)local_e0,local_c8);
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::push_back
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&__range2,
               (value_type *)local_e0);
    core::Pubkey::~Pubkey((Pubkey *)local_e0);
    std::__cxx11::string::~string(local_c8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  bVar2 = *(byte *)&address_factory_local->_vptr_AddressFactory;
  cfd::core::Script::Script((Script *)&redeem_script.field_0x30);
  cfd::core::Script::Script((Script *)local_158);
  bVar1 = local_28 == kP2shAddress;
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            ((int)&locking_script + 0x30,(vector *)(ulong)bVar2,SUB81(&__range2,0));
  cfd::core::Script::Script((Script *)&scriptsig.field_0x30);
  cfd::core::Script::Script((Script *)local_208);
  cfd::AddressFactory::CreateAddress
            ((AddressType)local_380,(Pubkey *)_addr_type,(Script *)(ulong)local_28,(Script *)0x0,
             (Script *)&locking_script.field_0x30);
  if (bVar1) {
    cfd::core::Script::operator=((Script *)local_158,(Script *)&locking_script.field_0x30);
  }
  else {
    cfd::core::Script::operator=
              ((Script *)&redeem_script.field_0x30,(Script *)&locking_script.field_0x30);
    bVar2 = cfd::core::Script::IsEmpty();
    if ((bVar2 & 1) == 0) {
      cfd::core::Script::operator=((Script *)local_158,(Script *)local_208);
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_3a0);
  std::__cxx11::string::~string(local_3a0);
  bVar2 = cfd::core::Script::IsEmpty();
  if ((bVar2 & 1) == 0) {
    cfd::core::Script::GetHex_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->redeem_script,local_3f8);
    std::__cxx11::string::~string(local_3f8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3c0,"redeemScript",&local_3c1);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&__return_storage_ptr__->ignore_items,(value_type *)local_3c0);
    local_3d8 = (_Base_ptr)pVar4.first._M_node;
    local_3d0 = pVar4.second;
    std::__cxx11::string::~string(local_3c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  }
  bVar2 = cfd::core::Script::IsEmpty();
  if ((bVar2 & 1) == 0) {
    cfd::core::Script::GetHex_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->witness_script,local_450);
    std::__cxx11::string::~string(local_450);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_418,"witnessScript",&local_419);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&__return_storage_ptr__->ignore_items,(value_type *)local_418);
    local_430 = (_Base_ptr)pVar4.first._M_node;
    local_428 = pVar4.second;
    std::__cxx11::string::~string(local_418);
    std::allocator<char>::~allocator((allocator<char> *)&local_419);
  }
  local_21 = 1;
  core::Address::~Address(local_380);
  core::Script::~Script((Script *)local_208);
  core::Script::~Script((Script *)&scriptsig.field_0x30);
  core::Script::~Script((Script *)&locking_script.field_0x30);
  core::Script::~Script((Script *)local_158);
  core::Script::~Script((Script *)&redeem_script.field_0x30);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&__range2);
  if ((local_21 & 1) == 0) {
    CreateMultisigResponseStruct::~CreateMultisigResponseStruct(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

CreateMultisigResponseStruct AddressApiBase::CreateMultisig(
    const CreateMultisigRequestStruct& request,
    const AddressFactory* address_factory) {
  CreateMultisigResponseStruct response;
  AddressType addr_type = ConvertAddressType(request.hash_type);
  if ((addr_type != AddressType::kP2shAddress) &&
      (addr_type != AddressType::kP2wshAddress) &&
      (addr_type != AddressType::kP2shP2wshAddress)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to CreateMultisig. Invalid address_type passed:  "
        "addressType={}",  // NOLINT
        addr_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid address_type. address_type must be \"p2sh\" "
        "\"p2wsh\" or \"p2sh-p2wsh\".");  // NOLINT
  }
  std::vector<Pubkey> pubkeys;
  for (std::string key : request.keys) {
    pubkeys.push_back(Pubkey(key));
  }

  uint32_t req_sig_num = static_cast<uint32_t>(request.nrequired);
  Script witness_script;
  Script redeem_script;

  bool is_witness = (addr_type != AddressType::kP2shAddress);
  Script multisig_script =
      ScriptUtil::CreateMultisigRedeemScript(req_sig_num, pubkeys, is_witness);
  Script locking_script;
  Script scriptsig;
  Address addr = address_factory->CreateAddress(
      addr_type, nullptr, &multisig_script, &locking_script, &scriptsig);
  if (is_witness) {
    witness_script = multisig_script;
    if (!scriptsig.IsEmpty()) {
      redeem_script = scriptsig;
    }
  } else {
    redeem_script = multisig_script;
  }

  response.address = addr.GetAddress();
  if (redeem_script.IsEmpty()) {
    response.ignore_items.insert("redeemScript");
  } else {
    response.redeem_script = redeem_script.GetHex();
  }
  if (witness_script.IsEmpty()) {
    response.ignore_items.insert("witnessScript");
  } else {
    response.witness_script = witness_script.GetHex();
  }
  return response;
}